

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

size_t av1_write_metadata_array(AV1_COMP *cpi,uint8_t *dst,size_t dst_size)

{
  ulong *puVar1;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  size_t sVar5;
  ulong in_RDX;
  uint8_t *in_RSI;
  long *in_RDI;
  bool is_layer_specific_obu_00;
  size_t obu_size;
  _Bool is_layer_specific_obu;
  int metadata_insert_location;
  aom_metadata_t *current_metadata;
  size_t i;
  size_t length_field_size;
  size_t total_bytes_written;
  size_t obu_payload_size;
  size_t obu_header_size;
  aom_metadata_array_t *arr;
  AV1_COMMON *cm;
  uint8_t *dest_size;
  uint8_t *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint8_t *dst_00;
  aom_metadata_t *metadata;
  size_t obu_payload_size_00;
  ulong local_20;
  uint8_t *local_18;
  uint8_t *local_8;
  
  if (in_RDI[0x84f5] == 0) {
    local_8 = (uint8_t *)0x0;
  }
  else {
    puVar1 = *(ulong **)(in_RDI[0x84f5] + 200);
    if (puVar1 == (ulong *)0x0) {
      local_8 = (uint8_t *)0x0;
    }
    else {
      local_8 = (uint8_t *)0x0;
      obu_payload_size_00 = 0;
      local_20 = in_RDX;
      local_18 = in_RSI;
      for (metadata = (aom_metadata_t *)0x0; metadata < (aom_metadata_t *)*puVar1;
          metadata = (aom_metadata_t *)((long)&metadata->type + 1)) {
        dst_00 = *(uint8_t **)(puVar1[1] + (long)metadata * 8);
        if (((dst_00 != (uint8_t *)0x0) && (*(long *)(dst_00 + 8) != 0)) &&
           (((uVar2 = *(uint *)(dst_00 + 0x18) & 0xf, (char)in_RDI[0x77f0] == '\0' && (uVar2 == 1))
            || ((((char)in_RDI[0x77f0] != '\0' && (uVar2 == 0)) || (uVar2 == 2)))))) {
          if (local_20 < 2) {
            aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_ERROR,
                               "av1_write_metadata_array: output buffer full");
          }
          is_layer_specific_obu_00 = (*(uint *)(dst_00 + 0x18) & 0x10) != 0;
          in_stack_ffffffffffffff98 =
               CONCAT13(is_layer_specific_obu_00,(int3)in_stack_ffffffffffffff98);
          dest_size = local_18;
          uVar3 = av1_write_obu_header
                            ((AV1LevelParams *)(*in_RDI + 0x5a90),(int *)(in_RDI + 0x13a60),
                             OBU_METADATA,(_Bool)(*(byte *)(in_RDI[0x8401] + 0xf4) & 1),
                             is_layer_specific_obu_00,0,local_18);
          sVar5 = av1_write_metadata_obu(metadata,dst_00,CONCAT44(uVar2,in_stack_ffffffffffffff98));
          if (sVar5 == 0) {
            aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_ERROR,
                               "av1_write_metadata_array: output buffer full");
          }
          obu_payload_size_00 =
               obu_memmove((size_t)local_8,obu_payload_size_00,(uint8_t *)metadata,(size_t)dst_00);
          if (obu_payload_size_00 == 0) {
            aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_ERROR,
                               "av1_write_metadata_array: output buffer full");
          }
          iVar4 = av1_write_uleb_obu_size
                            (CONCAT44(uVar2,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90,
                             (size_t)dest_size);
          if (iVar4 == 0) {
            in_stack_ffffffffffffff90 = (uint8_t *)(uVar3 + obu_payload_size_00 + sVar5);
            local_18 = in_stack_ffffffffffffff90 + (long)local_18;
            local_20 = local_20 - (long)in_stack_ffffffffffffff90;
            local_8 = in_stack_ffffffffffffff90 + (long)local_8;
          }
          else {
            aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_ERROR,
                               "av1_write_metadata_array: output buffer full");
          }
        }
      }
    }
  }
  return (size_t)local_8;
}

Assistant:

static size_t av1_write_metadata_array(AV1_COMP *const cpi, uint8_t *dst,
                                       size_t dst_size) {
  if (!cpi->source) return 0;
  AV1_COMMON *const cm = &cpi->common;
  aom_metadata_array_t *arr = cpi->source->metadata;
  if (!arr) return 0;
  size_t obu_header_size = 0;
  size_t obu_payload_size = 0;
  size_t total_bytes_written = 0;
  size_t length_field_size = 0;
  for (size_t i = 0; i < arr->sz; i++) {
    aom_metadata_t *current_metadata = arr->metadata_array[i];
    if (current_metadata && current_metadata->payload) {
      const int metadata_insert_location =
          current_metadata->insert_flag & AOM_MIF_INSERT_LOCATION_MASK;
      if ((cm->current_frame.frame_type == KEY_FRAME &&
           metadata_insert_location == AOM_MIF_KEY_FRAME) ||
          (cm->current_frame.frame_type != KEY_FRAME &&
           metadata_insert_location == AOM_MIF_NON_KEY_FRAME) ||
          metadata_insert_location == AOM_MIF_ANY_FRAME) {
        // OBU header is either one or two bytes.
        if (dst_size < 2) {
          aom_internal_error(cm->error, AOM_CODEC_ERROR,
                             "av1_write_metadata_array: output buffer full");
        }
        const bool is_layer_specific_obu =
            (current_metadata->insert_flag & AOM_MIF_LAYER_SPECIFIC) != 0;
        obu_header_size = av1_write_obu_header(
            &cpi->ppi->level_params, &cpi->frame_header_count, OBU_METADATA,
            cm->seq_params->has_nonzero_operating_point_idc,
            is_layer_specific_obu, 0, dst);
        assert(obu_header_size <= 2);
        obu_payload_size =
            av1_write_metadata_obu(current_metadata, dst + obu_header_size,
                                   dst_size - obu_header_size);
        if (obu_payload_size == 0) {
          aom_internal_error(cm->error, AOM_CODEC_ERROR,
                             "av1_write_metadata_array: output buffer full");
        }
        length_field_size =
            obu_memmove(obu_header_size, obu_payload_size, dst, dst_size);
        if (length_field_size == 0) {
          aom_internal_error(cm->error, AOM_CODEC_ERROR,
                             "av1_write_metadata_array: output buffer full");
        }
        if (av1_write_uleb_obu_size(obu_payload_size, dst + obu_header_size,
                                    length_field_size) == AOM_CODEC_OK) {
          const size_t obu_size =
              obu_header_size + length_field_size + obu_payload_size;
          dst += obu_size;
          dst_size -= obu_size;
          total_bytes_written += obu_size;
        } else {
          aom_internal_error(cpi->common.error, AOM_CODEC_ERROR,
                             "av1_write_metadata_array: output buffer full");
        }
      }
    }
  }
  return total_bytes_written;
}